

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxfastrt.h
# Opt level: O1

void __thiscall
soplex::
SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::setDelta(SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *newDelta)

{
  Tolerances *pTVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  bool bVar3;
  Real RVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  int32_t iVar8;
  int iVar9;
  cpp_dec_float<50U,_int,_void> local_58;
  
  pTVar1 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (this->
           super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      UNLOCK();
    }
    else {
      p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
    }
  }
  RVar4 = Tolerances::epsilon(pTVar1);
  bVar3 = false;
  if ((!NAN(RVar4)) && (bVar3 = false, (newDelta->m_backend).fpclass != cpp_dec_float_NaN)) {
    local_58.fpclass = cpp_dec_float_finite;
    local_58.prec_elem = 10;
    local_58.data._M_elems[0] = 0;
    local_58.data._M_elems[1] = 0;
    local_58.data._M_elems[2] = 0;
    local_58.data._M_elems[3] = 0;
    local_58.data._M_elems[4] = 0;
    local_58.data._M_elems[5] = 0;
    local_58.data._M_elems._24_5_ = 0;
    local_58.data._M_elems[7]._1_3_ = 0;
    local_58.data._M_elems._32_5_ = 0;
    local_58._37_8_ = 0;
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)&local_58,RVar4);
    iVar9 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                      (&newDelta->m_backend,&local_58);
    bVar3 = iVar9 < 1;
  }
  if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
  }
  if (bVar3) {
    pTVar1 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr
    ;
    p_Var2 = (this->
             super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             )._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi;
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
        UNLOCK();
      }
      else {
        p_Var2->_M_use_count = p_Var2->_M_use_count + 1;
      }
    }
    RVar4 = Tolerances::epsilon(pTVar1);
    boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
              ((cpp_dec_float<50u,int,void> *)newDelta,RVar4);
    if (p_Var2 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var2);
    }
  }
  *(undefined8 *)
   ((this->
    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).delta.m_backend.data._M_elems + 8) = *(undefined8 *)((newDelta->m_backend).data._M_elems + 8);
  uVar5 = *(undefined8 *)(newDelta->m_backend).data._M_elems;
  uVar6 = *(undefined8 *)((newDelta->m_backend).data._M_elems + 2);
  uVar7 = *(undefined8 *)((newDelta->m_backend).data._M_elems + 6);
  *(undefined8 *)
   ((this->
    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).delta.m_backend.data._M_elems + 4) = *(undefined8 *)((newDelta->m_backend).data._M_elems + 4);
  *(undefined8 *)
   ((this->
    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).delta.m_backend.data._M_elems + 6) = uVar7;
  *(undefined8 *)
   (this->
   super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
   ).delta.m_backend.data._M_elems = uVar5;
  *(undefined8 *)
   ((this->
    super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ).delta.m_backend.data._M_elems + 2) = uVar6;
  (this->
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).delta.m_backend.exp = (newDelta->m_backend).exp;
  (this->
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).delta.m_backend.neg = (newDelta->m_backend).neg;
  iVar8 = (newDelta->m_backend).prec_elem;
  (this->
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).delta.m_backend.fpclass = (newDelta->m_backend).fpclass;
  (this->
  super_SPxRatioTester<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  ).delta.m_backend.prec_elem = iVar8;
  uVar5 = *(undefined8 *)((newDelta->m_backend).data._M_elems + 2);
  uVar6 = *(undefined8 *)((newDelta->m_backend).data._M_elems + 4);
  uVar7 = *(undefined8 *)((newDelta->m_backend).data._M_elems + 6);
  *(undefined8 *)(this->fastDelta).m_backend.data._M_elems =
       *(undefined8 *)(newDelta->m_backend).data._M_elems;
  *(undefined8 *)((this->fastDelta).m_backend.data._M_elems + 2) = uVar5;
  *(undefined8 *)((this->fastDelta).m_backend.data._M_elems + 4) = uVar6;
  *(undefined8 *)((this->fastDelta).m_backend.data._M_elems + 6) = uVar7;
  *(undefined8 *)((this->fastDelta).m_backend.data._M_elems + 8) =
       *(undefined8 *)((newDelta->m_backend).data._M_elems + 8);
  (this->fastDelta).m_backend.exp = (newDelta->m_backend).exp;
  (this->fastDelta).m_backend.neg = (newDelta->m_backend).neg;
  iVar8 = (newDelta->m_backend).prec_elem;
  (this->fastDelta).m_backend.fpclass = (newDelta->m_backend).fpclass;
  (this->fastDelta).m_backend.prec_elem = iVar8;
  return;
}

Assistant:

virtual void setDelta(R newDelta)
   {
      if(newDelta <= this->tolerances()->epsilon())
         newDelta = this->tolerances()->epsilon();

      this->delta = newDelta;
      fastDelta = newDelta;
   }